

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BLBackTrace.cpp
# Opt level: O0

void amrex::BLBackTrace::print_backtrace_info(string *filename)

{
  char *__filename;
  FILE *__stream;
  Print *this;
  Print *func;
  FILE *p;
  FILE *in_stack_00000350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe38;
  Print *in_stack_fffffffffffffe40;
  ostream *in_stack_fffffffffffffe68;
  Print *in_stack_fffffffffffffe70;
  Print *in_stack_fffffffffffffeb0;
  
  __filename = (char *)std::__cxx11::string::c_str();
  __stream = fopen(__filename,"w");
  if (__stream == (FILE *)0x0) {
    OutStream();
    Print::Print(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    Print::operator<<(in_stack_fffffffffffffe40,(char (*) [46])in_stack_fffffffffffffe38);
    this = Print::operator<<(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    func = Print::operator<<(this,(char (*) [29])in_stack_fffffffffffffe38);
    Print::operator<<(this,(_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                            *)func);
    Print::~Print(in_stack_fffffffffffffeb0);
  }
  else {
    print_backtrace_info(in_stack_00000350);
    fclose(__stream);
  }
  return;
}

Assistant:

void
BLBackTrace::print_backtrace_info (const std::string& filename)
{
    if (FILE* p = fopen(filename.c_str(), "w"))
    {
      BLBackTrace::print_backtrace_info(p);
      fclose(p);
    }
    else
    {
        amrex::Print() << "Warning @ BLBackTrace::print_backtrace_info: "
                       << filename << " is not a valid output file."
                       << std::endl;
    }
}